

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

string * find_in_path(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *paths,string *fname)

{
  bool bVar1;
  undefined1 uVar2;
  reference pbVar3;
  char *pcVar4;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  ifstream f;
  string path;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string delimiter;
  string *full;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  allocator *paVar5;
  undefined6 in_stack_fffffffffffffd08;
  byte in_stack_fffffffffffffd0e;
  string *__lhs;
  allocator local_2c5;
  uint local_2c4;
  undefined1 local_2c0 [527];
  byte local_b1;
  string local_b0 [39];
  byte local_89;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60 [4];
  allocator local_39;
  string local_38 [56];
  
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"/",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_60[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffcf8);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_fffffffffffffcf8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd00,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffcf8), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(local_60);
    std::__cxx11::string::string(local_88,(string *)pbVar3);
    local_89 = 0;
    local_b1 = 0;
    uVar2 = ends_with(in_RSI,in_RDX);
    if ((bool)uVar2) {
      std::operator+(__lhs,in_RDI);
    }
    else {
      std::operator+(__lhs,in_RDI);
      local_b1 = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08)),
                     in_stack_fffffffffffffd00);
    }
    if ((local_b1 & 1) != 0) {
      std::__cxx11::string::~string(local_b0);
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_2c0,pcVar4,_S_in);
    in_stack_fffffffffffffd0e = std::ios::good();
    bVar1 = (in_stack_fffffffffffffd0e & 1) != 0;
    if (bVar1) {
      local_89 = 1;
    }
    local_2c4 = (uint)bVar1;
    std::ifstream::~ifstream(local_2c0);
    if ((local_89 & 1) == 0) {
      std::__cxx11::string::~string((string *)in_RDI);
    }
    if (local_2c4 == 0) {
      local_2c4 = 0;
    }
    std::__cxx11::string::~string(local_88);
    if (local_2c4 != 0) goto LAB_0017c1d6;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(local_60);
  }
  paVar5 = &local_2c5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",paVar5);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c5);
  local_2c4 = 1;
LAB_0017c1d6:
  std::__cxx11::string::~string(local_38);
  return __lhs;
}

Assistant:

string find_in_path(vector<string> paths, string fname)
{
#ifdef _WIN32
  string delimiter = "\\";
#else
  string delimiter = "/";
#endif
  for (string path : paths)
  {
    string full = ends_with(path, delimiter) ? (path + fname) : (path + delimiter + fname);
    ifstream f(full.c_str());
    if (f.good())
      return full;
  }
  return "";
}